

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmq.hpp
# Opt level: O2

__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __thiscall
rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>::
query(rmq<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_unsigned_long>
      *this,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> range_begin,
     __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> range_end)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  pointer pvVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var23;
  ulong uVar24;
  
  piVar3 = (this->_begin)._M_current;
  uVar21 = (long)range_begin._M_current - (long)piVar3 >> 2;
  uVar24 = (long)range_end._M_current - (long)piVar3 >> 2;
  if (uVar24 <= uVar21) {
    __assert_fail("begin_idx < end_idx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0xb5,
                  "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
                 );
  }
  if (this->n < uVar24) {
    __assert_fail("end_idx <= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                  ,0xb6,
                  "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
                 );
  }
  uVar18 = uVar21 - 1;
  uVar20 = this->superblock_size;
  uVar14 = uVar18 / uVar20 + 1;
  if (piVar3 == range_begin._M_current) {
    uVar14 = 0;
  }
  uVar7 = uVar24 / uVar20;
  uVar8 = uVar7 - uVar14;
  _Var23._M_current = range_begin._M_current;
  if (uVar7 < uVar14 || uVar8 == 0) {
LAB_00106f8e:
    uVar8 = uVar14 - 1;
    if ((uVar8 < uVar7) && (uVar21 != uVar14 * uVar20)) {
      uVar13 = this->n_blocks_per_superblock;
      lVar16 = uVar18 / this->block_size + 1;
      uVar19 = this->block_size * lVar16;
      uVar17 = lVar16 - uVar13 * uVar8;
      if (uVar13 != uVar17) {
        uVar9 = ~uVar17 + uVar13;
        if (uVar9 == 0) {
          uVar12 = 0x40;
        }
        else {
          lVar16 = 0x3f;
          if (uVar9 != 0) {
            for (; uVar9 >> lVar16 == 0; lVar16 = lVar16 + -1) {
            }
          }
          uVar12 = (uint)lVar16 ^ 0x3f;
        }
        if (piVar3[(ulong)*(ushort *)
                           (uVar17 * 2 +
                            *(long *)&(this->block_mins).
                                      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[0x40 - uVar12].
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl.super__Vector_impl_data +
                           (uVar13 - (long)((1 << (-(char)uVar12 & 0x1fU)) / 2)) * uVar8 * 2) +
                   uVar20 * uVar8] < *_Var23._M_current) {
          _Var23._M_current =
               piVar3 + (ulong)*(ushort *)
                                (uVar17 * 2 +
                                 *(long *)&(this->block_mins).
                                           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[0x40 - uVar12].
                                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                           ._M_impl.super__Vector_impl_data +
                                (uVar13 - (long)((1 << (-(char)uVar12 & 0x1fU)) / 2)) * uVar8 * 2) +
                        uVar20 * uVar8;
        }
      }
      if ((uVar21 <= uVar19 && uVar19 - uVar21 != 0) &&
         (_Var10 = std::
                   __min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                             (range_begin._M_current,piVar3 + uVar19),
         *_Var10._M_current < *_Var23._M_current)) {
        _Var23 = _Var10;
      }
    }
    if (((uVar14 <= uVar7) && (uVar7 != this->n_superblocks)) &&
       (uVar20 = this->superblock_size * uVar7, uVar24 != uVar20)) {
      lVar16 = this->n_blocks_per_superblock * uVar7;
      uVar13 = uVar24 / this->block_size;
      uVar17 = uVar13 - lVar16;
      if (uVar17 != 0) {
        uVar19 = 0x3f;
        if (uVar17 != 0) {
          for (; uVar17 >> uVar19 == 0; uVar19 = uVar19 - 1) {
          }
        }
        iVar15 = 1 << ((byte)uVar19 & 0x1f);
        lVar11 = (long)(iVar15 / 2) * uVar7;
        piVar5 = (this->_begin)._M_current;
        lVar22 = *(long *)&(this->block_mins).
                           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar19 & 0xffffffff].
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data;
        piVar1 = piVar5 + *(ushort *)(lVar22 + (lVar16 - lVar11) * 2) + uVar20;
        iVar6 = *piVar1;
        iVar2 = *_Var23._M_current;
        if (iVar6 < *_Var23._M_current) {
          _Var23._M_current = piVar1;
          iVar2 = iVar6;
        }
        piVar5 = piVar5 + *(ushort *)(lVar22 + (uVar13 - (iVar15 + lVar11)) * 2) + uVar20;
        if (*piVar5 < iVar2) {
          _Var23._M_current = piVar5;
        }
      }
      uVar13 = uVar13 * this->block_size;
      if ((uVar13 < uVar24) &&
         (_Var10 = std::
                   __min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                             ((this->_begin)._M_current + uVar13,range_end._M_current),
         *_Var10._M_current < *_Var23._M_current)) {
        _Var23 = _Var10;
      }
    }
    if (uVar7 < uVar14) {
      uVar20 = this->block_size;
      uVar18 = uVar18 / uVar20 + 1;
      if (piVar3 == range_begin._M_current) {
        uVar18 = 0;
      }
      uVar7 = uVar24 / uVar20;
      uVar13 = uVar7 - uVar18;
      if (uVar18 <= uVar7 && uVar13 != 0) {
        if (uVar18 / this->n_blocks_per_superblock != uVar7 / this->n_blocks_per_superblock) {
          __assert_fail("left_b / n_blocks_per_superblock == right_b / n_blocks_per_superblock",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                        ,0x114,
                        "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
                       );
        }
        uVar17 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar17 == 0; uVar17 = uVar17 - 1) {
          }
        }
        iVar6 = 1 << ((byte)uVar17 & 0x1f);
        if (uVar14 < 2) {
          lVar22 = 0;
          lVar16 = 0;
        }
        else {
          lVar16 = (long)(iVar6 / 2) * uVar8;
          lVar22 = uVar8 * this->superblock_size;
        }
        piVar3 = (this->_begin)._M_current;
        lVar11 = *(long *)&(this->block_mins).
                           super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar17 & 0xffffffff].
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data;
        iVar2 = piVar3[(ulong)*(ushort *)(lVar11 + (uVar18 - lVar16) * 2) + lVar22];
        iVar15 = *_Var23._M_current;
        if (iVar2 < *_Var23._M_current) {
          _Var23._M_current = piVar3 + (ulong)*(ushort *)(lVar11 + (uVar18 - lVar16) * 2) + lVar22;
          iVar15 = iVar2;
        }
        if (piVar3[(ulong)*(ushort *)(lVar11 + (uVar7 - (iVar6 + lVar16)) * 2) + lVar22] < iVar15) {
          _Var23._M_current =
               piVar3 + (ulong)*(ushort *)(lVar11 + (uVar7 - (iVar6 + lVar16)) * 2) + lVar22;
        }
        if (uVar21 < uVar18 * uVar20) {
          _Var10 = std::
                   __min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                             (range_begin._M_current,piVar3 + uVar18 * uVar20);
          if (*_Var10._M_current < *_Var23._M_current) {
            _Var23 = _Var10;
          }
          uVar20 = this->block_size;
        }
        if (uVar24 <= uVar20 * uVar7) {
          return (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 _Var23._M_current;
        }
        range_begin._M_current = (this->_begin)._M_current + uVar20 * uVar7;
      }
      _Var10 = std::
               __min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                         (range_begin._M_current,range_end._M_current);
      if (*_Var10._M_current < *_Var23._M_current) {
        _Var23 = _Var10;
      }
    }
    return (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)_Var23._M_current;
  }
  uVar13 = 0x3f;
  if (uVar8 != 0) {
    for (; uVar8 >> uVar13 == 0; uVar13 = uVar13 - 1) {
    }
  }
  uVar13 = uVar13 & 0xffffffff;
  pvVar4 = (this->superblock_mins).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar13 < (ulong)(((long)(this->superblock_mins).
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18)) {
    lVar16 = *(long *)&pvVar4[uVar13].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data;
    uVar8 = (long)*(pointer *)
                   ((long)&pvVar4[uVar13].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data + 8) - lVar16 >> 3;
    if (uVar14 < uVar8) {
      uVar13 = uVar7 - (long)(1 << ((byte)uVar13 & 0x1f));
      if (uVar8 <= uVar13) {
        __assert_fail("dist < superblock_mins.size() && right_sb - (1<<dist) < superblock_mins[dist].size()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                      ,0xcb,
                      "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
                     );
      }
      _Var23._M_current = piVar3 + *(long *)(lVar16 + uVar14 * 8);
      if (piVar3[*(long *)(lVar16 + uVar13 * 8)] < piVar3[*(long *)(lVar16 + uVar14 * 8)]) {
        _Var23._M_current = piVar3 + *(long *)(lVar16 + uVar13 * 8);
      }
      goto LAB_00106f8e;
    }
  }
  __assert_fail("dist < superblock_mins.size() && left_sb < superblock_mins[dist].size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/rmq.hpp"
                ,0xc9,
                "Iterator rmq<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>::query(Iterator, Iterator) [Iterator = __gnu_cxx::__normal_iterator<int *, std::vector<int>>, index_t = unsigned long]"
               );
}

Assistant:

Iterator query(Iterator range_begin, Iterator range_end) {
        // find superblocks fully contained within range
        index_t begin_idx = std::distance(_begin, range_begin);
        index_t end_idx = std::distance(_begin, range_end);
        assert(begin_idx < end_idx);
        assert(end_idx <= n);

        // round up to next superblock
        index_t left_sb  = (begin_idx - 1) / superblock_size + 1;
        if (begin_idx == 0)
            left_sb = 0;
        // round down to prev superblock
        index_t right_sb = end_idx / superblock_size;

        // init result
        Iterator min_pos = range_begin;

        // if there is at least one superblock
        if (left_sb < right_sb) {
            // get largest power of two that doesn't exceed the number of
            // superblocks from (left,right)
            index_t n_sb = right_sb - left_sb;
            unsigned int dist = floorlog2(n_sb);

            assert(dist < superblock_mins.size() && left_sb < superblock_mins[dist].size());
            min_pos = _begin + superblock_mins[dist][left_sb];
            assert(dist < superblock_mins.size() && right_sb - (1<<dist) < superblock_mins[dist].size());
            Iterator right_sb_min = _begin + superblock_mins[dist][right_sb - (1 << dist)];
            if (*min_pos > *right_sb_min) {
                min_pos = right_sb_min;
            }
        }

        // go to left -> blocks -> sub-block
        if (left_sb <= right_sb && left_sb != 0 && begin_idx != left_sb*superblock_size) {
            index_t left_b = (begin_idx - 1) / block_size + 1;
            index_t left_b_gidx = left_b * block_size;
            left_b -= (left_sb - 1)*n_blocks_per_superblock;
            index_t n_b = n_blocks_per_superblock - left_b;
            if (n_b > 0) {
                unsigned int level = ceillog2(n_b);
                index_t sb_offset = (left_sb-1)*(n_blocks_per_superblock - (1<<level)/2);
                Iterator block_min_it = _begin + block_mins[level][left_b + sb_offset] + (left_sb-1)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
            }

            // go left into remaining block, if elements left
            if (left_b_gidx > begin_idx) {
                // linearly search (at most block_size elements)
                Iterator inblock_min_it = std::min_element(range_begin, _begin + left_b_gidx);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }
        }

        // go to right -> blocks -> sub-block
        if (left_sb <= right_sb && right_sb != n_superblocks && end_idx != right_sb*superblock_size) {
            index_t left_b = right_sb*n_blocks_per_superblock;
            index_t right_b = end_idx / block_size;
            index_t n_b = right_b - left_b;
            if (n_b > 0) {
                unsigned int dist = floorlog2(n_b);
                index_t sb_offset = right_sb*((1<<dist)/2);
                Iterator block_min_it = _begin + block_mins[dist][left_b - sb_offset] + (right_sb)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
                block_min_it = _begin + block_mins[dist][right_b - sb_offset - (1<<dist)] + (right_sb)*superblock_size;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
            }

            // go right into remaining block, if elements left
            index_t left_gl_idx = right_b*block_size;
            if (left_gl_idx < end_idx) {
                // linearly search (at most block_size elements)
                Iterator inblock_min_it = std::min_element(_begin + left_gl_idx, range_end);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }
        }

        // if there are no superblocks covered (both indeces in same superblock)
        if (left_sb > right_sb) {
            index_t left_b = (begin_idx - 1) / block_size + 1;
            if (begin_idx == 0)
                left_b = 0;
            index_t right_b = end_idx / block_size;


            if (left_b < right_b) {
                // if blocks are in between: get mins of blocks in range
                // NOTE: there was a while if-else block here to handle the
                //       case if blocks would span accross the boundary of two
                //       superblocks, this should however never happen
                //       git blame this line to find where this code was removed
                // assert blocks lie in the same superblock
                assert(left_b / n_blocks_per_superblock == right_b / n_blocks_per_superblock);

                unsigned int dist = floorlog2(right_b - left_b);
                index_t sb_offset = 0;
                index_t sb_size_offset = 0;
                if (left_sb > 1) {
                    sb_offset = (left_sb-1)*((1<<dist)/2);
                    sb_size_offset = (left_sb-1)*superblock_size;
                }
                Iterator block_min_it = _begin + block_mins[dist][left_b - sb_offset] + sb_size_offset;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;
                block_min_it = _begin + block_mins[dist][right_b - sb_offset - (1<<dist)] + sb_size_offset;
                if (*block_min_it < *min_pos)
                    min_pos = block_min_it;

                // remaining inblock
                if (begin_idx < left_b*block_size) {
                    Iterator inblock_min_it = std::min_element(range_begin, _begin + left_b*block_size);
                    if (*inblock_min_it < *min_pos) {
                        min_pos = inblock_min_it;
                    }
                }
                if (end_idx > right_b*block_size) {
                    Iterator inblock_min_it = std::min_element(_begin + right_b*block_size, range_end);
                    if (*inblock_min_it < *min_pos) {
                        min_pos = inblock_min_it;
                    }
                }
            } else {
                // no blocks at all
                Iterator inblock_min_it = std::min_element(range_begin, range_end);
                if (*inblock_min_it < *min_pos) {
                    min_pos = inblock_min_it;
                }
            }

        }

        // return the minimum found
        return min_pos;
    }